

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExpressionCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionCoverageBinInitializerSyntax,slang::syntax::ExpressionCoverageBinInitializerSyntax_const&>
          (BumpAllocator *this,ExpressionCoverageBinInitializerSyntax *args)

{
  SyntaxNode *pSVar1;
  ExpressionSyntax *pEVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  ExpressionCoverageBinInitializerSyntax *pEVar5;
  
  pEVar5 = (ExpressionCoverageBinInitializerSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExpressionCoverageBinInitializerSyntax *)this->endPtr < pEVar5 + 1) {
    pEVar5 = (ExpressionCoverageBinInitializerSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pEVar5 + 1);
  }
  SVar3 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(args->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent;
  pEVar2 = (args->expr).ptr;
  (pEVar5->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode =
       (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode;
  (pEVar5->expr).ptr = pEVar2;
  (pEVar5->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(pEVar5->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pEVar5->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent = pSVar1;
  return pEVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }